

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

boolean is_racial_weapon(obj *otmp,monst *mtmp)

{
  permonst *ppVar1;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  permonst *mdat;
  monst *mtmp_local;
  obj *otmp_local;
  
  if (mtmp == &youmonst) {
    if (urace.malenum == 0x2d) {
      local_29 = true;
      if ((otmp->otyp != 0xd) && (local_29 = true, otmp->otyp != 0x20)) {
        local_29 = otmp->otyp == 0x33;
      }
      return local_29;
    }
    if (urace.malenum == 0x111) {
      local_2a = true;
      if ((((otmp->otyp != 2) && (local_2a = true, otmp->otyp != 0xb)) &&
          (local_2a = true, otmp->otyp != 0x12)) &&
         ((local_2a = true, otmp->otyp != 0x1e && (local_2a = true, otmp->otyp != 0x25)))) {
        local_2a = otmp->otyp == 0x43;
      }
      return local_2a;
    }
    if (urace.malenum == 0xaa) {
      return '\0';
    }
    if (urace.malenum == 0x4a) {
      local_2b = true;
      if (((otmp->otyp != 3) && (local_2b = true, otmp->otyp != 0xc)) &&
         ((local_2b = true, otmp->otyp != 0x13 && (local_2b = true, otmp->otyp != 0x1f)))) {
        local_2b = otmp->otyp == 0x44;
      }
      return local_2b;
    }
  }
  else if (mtmp != (monst *)0x0) {
    ppVar1 = mtmp->data;
    if ((ppVar1->mflags2 & 0x20) != 0) {
      local_2c = true;
      if ((otmp->otyp != 0xd) && (local_2c = true, otmp->otyp != 0x20)) {
        local_2c = otmp->otyp == 0x33;
      }
      return local_2c;
    }
    if ((ppVar1->mflags2 & 0x10) != 0) {
      local_2d = true;
      if ((((otmp->otyp != 2) && (local_2d = true, otmp->otyp != 0xb)) &&
          (local_2d = true, otmp->otyp != 0x12)) &&
         ((local_2d = true, otmp->otyp != 0x1e && (local_2d = true, otmp->otyp != 0x25)))) {
        local_2d = otmp->otyp == 0x43;
      }
      return local_2d;
    }
    if ((ppVar1->mflags2 & 0x40) != 0) {
      return '\0';
    }
    if ((ppVar1->mflags2 & 0x80) != 0) {
      local_2e = true;
      if (((otmp->otyp != 3) && (local_2e = true, otmp->otyp != 0xc)) &&
         ((local_2e = true, otmp->otyp != 0x13 && (local_2e = true, otmp->otyp != 0x1f)))) {
        local_2e = otmp->otyp == 0x44;
      }
      return local_2e;
    }
  }
  return '\0';
}

Assistant:

boolean is_racial_weapon(const struct obj *otmp, const struct monst *mtmp)
{
	if (mtmp == &youmonst) {
	    if (Race_if(PM_DWARF)) return is_dwarvish_weapon(otmp);
	    else if (Race_if(PM_ELF)) return is_elven_weapon(otmp);
	    else if (Race_if(PM_GNOME)) return is_gnomish_weapon(otmp);
	    else if (Race_if(PM_ORC)) return is_orcish_weapon(otmp);
	} else if (mtmp) {
	    const struct permonst *mdat = mtmp->data;
	    if (is_dwarf(mdat)) return is_dwarvish_weapon(otmp);
	    else if (is_elf(mdat)) return is_elven_weapon(otmp);
	    else if (is_gnome(mdat)) return is_gnomish_weapon(otmp);
	    else if (is_orc(mdat)) return is_orcish_weapon(otmp);
	}
	return FALSE;
}